

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double insphereslow(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  double b;
  double b_00;
  double b_01;
  double b_02;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double b_03;
  double b_04;
  double b_05;
  double b_06;
  double b_07;
  double b_08;
  double b_09;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double b_10;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double b_11;
  double b_12;
  double b_13;
  double b_14;
  double b_15;
  double b_16;
  double b_17;
  double dVar52;
  double dVar53;
  double dVar54;
  double b_18;
  double dVar55;
  double dVar56;
  double dVar57;
  double b_19;
  double dVar58;
  double b_20;
  double dVar59;
  double dVar60;
  double dVar61;
  double ac [16];
  double da [16];
  double bc [16];
  double ab [16];
  double temp32a [32];
  double temp64b [64];
  double temp64a [64];
  double temp32b [32];
  double bd [16];
  double cd [16];
  double dxby [8];
  double cxay [8];
  double axdy [8];
  double dxcy [8];
  double cxby [8];
  double bxay [8];
  double bxdy [8];
  double axcy [8];
  double dxay [8];
  double cxdy [8];
  double bxcy [8];
  double axby [8];
  double temp192 [192];
  double temp64c [64];
  double temp128 [128];
  double detzzt [768];
  double detzt [384];
  double detyyt [768];
  double detyt [384];
  double detxxt [768];
  double detxt [384];
  double detzz [768];
  double detz [384];
  double detyy [768];
  double dety [384];
  double detxx [768];
  double detx [384];
  double detztzt [768];
  double detytyt [768];
  double detxtxt [768];
  double y2 [2304];
  double x2 [2304];
  double z1 [1536];
  double y1 [1536];
  double x1 [1536];
  double z2 [2304];
  double detxy [4608];
  double cdet [6912];
  double bdet [6912];
  double adet [6912];
  double ddet [6912];
  double deter [27648];
  double cddet [13824];
  double abdet [13824];
  double dStack_d5288;
  double dStack_d5278;
  double dStack_d51d8;
  double dStack_d51c8;
  double adStack_d5038 [16];
  double adStack_d4fb8 [16];
  double adStack_d4f38 [16];
  double adStack_d4eb8 [16];
  double adStack_d4e38 [32];
  double adStack_d4d38 [64];
  double adStack_d4b38 [64];
  double adStack_d4938 [32];
  double adStack_d4838 [16];
  double adStack_d47b8 [16];
  double dStack_d4738;
  double dStack_d4730;
  double dStack_d4728;
  double dStack_d4720;
  double dStack_d4718;
  double dStack_d4710;
  double dStack_d4708;
  double dStack_d4700;
  double dStack_d46f8;
  double dStack_d46f0;
  double dStack_d46e8;
  double dStack_d46e0;
  double dStack_d46d8;
  double dStack_d46d0;
  double dStack_d46c8;
  double dStack_d46c0;
  double dStack_d46b8;
  double dStack_d46b0;
  double dStack_d46a8;
  double dStack_d46a0;
  double dStack_d4698;
  double dStack_d4690;
  double dStack_d4688;
  double dStack_d4680;
  double dStack_d4678;
  double dStack_d4670;
  double dStack_d4668;
  double dStack_d4660;
  double dStack_d4658;
  double dStack_d4650;
  double dStack_d4648;
  double dStack_d4640;
  double dStack_d4638;
  double dStack_d4630;
  double dStack_d4628;
  double dStack_d4620;
  double dStack_d4618;
  double dStack_d4610;
  double dStack_d4608;
  double dStack_d4600;
  double dStack_d45f8;
  double dStack_d45f0;
  double dStack_d45e8;
  double dStack_d45e0;
  double dStack_d45d8;
  double dStack_d45d0;
  double dStack_d45c8;
  double dStack_d45c0;
  double dStack_d45b8;
  double dStack_d45b0;
  double dStack_d45a8;
  double dStack_d45a0;
  double dStack_d4598;
  double dStack_d4590;
  double dStack_d4588;
  double dStack_d4580;
  double dStack_d4578;
  double dStack_d4570;
  double dStack_d4568;
  double dStack_d4560;
  double dStack_d4558;
  double dStack_d4550;
  double dStack_d4548;
  double dStack_d4540;
  double dStack_d4538;
  double dStack_d4530;
  double dStack_d4528;
  double dStack_d4520;
  double dStack_d4518;
  double dStack_d4510;
  double dStack_d4508;
  double dStack_d4500;
  double dStack_d44f8;
  double dStack_d44f0;
  double dStack_d44e8;
  double dStack_d44e0;
  double dStack_d44d8;
  double dStack_d44d0;
  double dStack_d44c8;
  double dStack_d44c0;
  double dStack_d44b8;
  double dStack_d44b0;
  double dStack_d44a8;
  double dStack_d44a0;
  double dStack_d4498;
  double dStack_d4490;
  double dStack_d4488;
  double dStack_d4480;
  double dStack_d4478;
  double dStack_d4470;
  double dStack_d4468;
  double dStack_d4460;
  double dStack_d4458;
  double dStack_d4450;
  double dStack_d4448;
  double dStack_d4440;
  double adStack_d4438 [192];
  double adStack_d3e38 [64];
  double adStack_d3c38 [128];
  double adStack_d3838 [768];
  double adStack_d2038 [384];
  double adStack_d1438 [768];
  double adStack_cfc38 [384];
  double adStack_cf038 [768];
  double adStack_cd838 [384];
  double adStack_ccc38 [768];
  double adStack_cb438 [384];
  double adStack_ca838 [768];
  double adStack_c9038 [384];
  double adStack_c8438 [768];
  double adStack_c6c38 [384];
  double adStack_c6038 [768];
  double adStack_c4838 [768];
  double adStack_c3038 [768];
  double adStack_c1838 [2304];
  double adStack_bd038 [2304];
  double adStack_b8838 [1536];
  double adStack_b5838 [1536];
  double adStack_b2838 [1536];
  double adStack_af838 [2304];
  double adStack_ab038 [4608];
  double adStack_a2038 [6912];
  double adStack_94838 [6912];
  double adStack_87038 [6912];
  double adStack_79838 [6911];
  double adStack_6c040 [27649];
  double adStack_36038 [13824];
  double adStack_1b038 [13825];
  
  dVar39 = splitter;
  dVar1 = *pa;
  dVar2 = pa[1];
  dVar19 = *pe;
  dVar40 = pe[1];
  b_20 = dVar1 - dVar19;
  b_10 = (dVar1 - (b_20 + (dVar1 - b_20))) + ((dVar1 - b_20) - dVar19);
  b = dVar2 - dVar40;
  b_11 = (dVar2 - (b + (dVar2 - b))) + ((dVar2 - b) - dVar40);
  dVar1 = pa[2];
  dVar2 = pe[2];
  b_00 = dVar1 - dVar2;
  dVar3 = *pb;
  dVar29 = pb[1];
  b_03 = dVar3 - dVar19;
  b_12 = (dVar3 - (b_03 + (dVar3 - b_03))) + ((dVar3 - b_03) - dVar19);
  b_19 = dVar29 - dVar40;
  b_18 = (dVar29 - (b_19 + (dVar29 - b_19))) + ((dVar29 - b_19) - dVar40);
  dVar3 = pb[2];
  b_04 = dVar3 - dVar2;
  b_13 = (dVar3 - (b_04 + (dVar3 - b_04))) + ((dVar3 - b_04) - dVar2);
  dVar3 = *pc;
  b_05 = dVar3 - dVar19;
  b_14 = (dVar3 - (b_05 + (dVar3 - b_05))) + ((dVar3 - b_05) - dVar19);
  dVar3 = pc[1];
  b_06 = dVar3 - dVar40;
  b_15 = (dVar3 - (b_06 + (dVar3 - b_06))) + ((dVar3 - b_06) - dVar40);
  dVar3 = pc[2];
  b_07 = dVar3 - dVar2;
  b_16 = (dVar3 - (b_07 + (dVar3 - b_07))) + ((dVar3 - b_07) - dVar2);
  dVar3 = *pd;
  b_08 = dVar3 - dVar19;
  b_17 = (dVar3 - (b_08 + (dVar3 - b_08))) + ((dVar3 - b_08) - dVar19);
  dVar19 = pd[1];
  b_01 = dVar19 - dVar40;
  b_09 = (dVar19 - (b_01 + (dVar19 - b_01))) + ((dVar19 - b_01) - dVar40);
  dVar19 = pd[2];
  dVar3 = dVar19 - dVar2;
  b_02 = (dVar19 - (dVar3 + (dVar19 - dVar3))) + ((dVar19 - dVar3) - dVar2);
  dVar29 = b_10 * splitter - (b_10 * splitter - b_10);
  dVar19 = b_18 * splitter - (b_18 * splitter - b_18);
  dVar40 = b_10 * b_18;
  dVar17 = b_10 - dVar29;
  dVar18 = b_18 - dVar19;
  dStack_d4478 = dVar17 * dVar18 -
                 (((dVar40 - dVar29 * dVar19) - dVar17 * dVar19) - dVar29 * dVar18);
  dVar41 = b_20 * splitter - (b_20 * splitter - b_20);
  dVar23 = b_20 * b_18;
  dVar16 = b_20 - dVar41;
  dVar19 = dVar18 * dVar16 - (((dVar23 - dVar41 * dVar19) - dVar19 * dVar16) - dVar41 * dVar18);
  dVar18 = dVar40 + dVar19;
  dVar40 = (dVar40 - (dVar18 - (dVar18 - dVar40))) + (dVar19 - (dVar18 - dVar40));
  dVar19 = dVar23 + dVar18;
  dVar18 = dVar18 - (dVar19 - dVar23);
  dVar36 = b_19 * splitter - (b_19 * splitter - b_19);
  dVar23 = b_10 * b_19;
  dVar30 = b_19 - dVar36;
  dVar24 = dVar17 * dVar30 - (((dVar23 - dVar29 * dVar36) - dVar17 * dVar36) - dVar29 * dVar30);
  dVar42 = dVar24 + dVar40;
  dStack_d4470 = (dVar40 - (dVar42 - (dVar42 - dVar40))) + (dVar24 - (dVar42 - dVar40));
  dVar24 = dVar18 + dVar42;
  dVar18 = (dVar18 - (dVar24 - (dVar24 - dVar18))) + (dVar42 - (dVar24 - dVar18));
  dVar40 = dVar19 + dVar24;
  dVar19 = (dVar19 - (dVar40 - (dVar40 - dVar19))) + (dVar24 - (dVar40 - dVar19));
  dVar42 = b_20 * b_19;
  dVar24 = dVar30 * dVar16 - (((dVar42 - dVar41 * dVar36) - dVar36 * dVar16) - dVar41 * dVar30);
  dVar30 = dVar23 + dVar24;
  dVar23 = (dVar23 - (dVar30 - (dVar30 - dVar23))) + (dVar24 - (dVar30 - dVar23));
  dVar24 = dVar23 + dVar18;
  dStack_d4468 = (dVar18 - (dVar24 - (dVar24 - dVar18))) + (dVar23 - (dVar24 - dVar18));
  dVar23 = dVar19 + dVar24;
  dVar19 = (dVar19 - (dVar23 - (dVar23 - dVar19))) + (dVar24 - (dVar23 - dVar19));
  dVar18 = dVar40 + dVar23;
  dVar40 = (dVar40 - (dVar18 - (dVar18 - dVar40))) + (dVar23 - (dVar18 - dVar40));
  dVar23 = dVar42 + dVar30;
  dVar24 = (dVar42 - (dVar23 - (dVar23 - dVar42))) + (dVar30 - (dVar23 - dVar42));
  dVar30 = dVar24 + dVar19;
  dStack_d4460 = (dVar19 - (dVar30 - (dVar30 - dVar19))) + (dVar24 - (dVar30 - dVar19));
  dVar24 = dVar40 + dVar30;
  dVar40 = (dVar40 - (dVar24 - (dVar24 - dVar40))) + (dVar30 - (dVar24 - dVar40));
  dVar19 = dVar18 + dVar24;
  dVar18 = (dVar18 - (dVar19 - (dVar19 - dVar18))) + (dVar24 - (dVar19 - dVar18));
  dVar24 = dVar23 + dVar40;
  dStack_d4458 = (dVar40 - (dVar24 - (dVar24 - dVar40))) + (dVar23 - (dVar24 - dVar40));
  dVar40 = dVar18 + dVar24;
  dStack_d4450 = (dVar18 - (dVar40 - (dVar40 - dVar18))) + (dVar24 - (dVar40 - dVar18));
  dStack_d4440 = dVar19 + dVar40;
  dStack_d4448 = (dVar19 - (dStack_d4440 - (dStack_d4440 - dVar19))) +
                 (dVar40 - (dStack_d4440 - dVar19));
  dVar18 = b_12 * splitter - (b_12 * splitter - b_12);
  dVar24 = -b_11;
  dVar25 = splitter * dVar24 - (b_11 + splitter * dVar24);
  dVar40 = b_12 * dVar24;
  dVar42 = b_12 - dVar18;
  dVar20 = dVar24 - dVar25;
  dStack_d45f8 = dVar42 * dVar20 -
                 (((dVar40 - dVar18 * dVar25) - dVar42 * dVar25) - dVar18 * dVar20);
  dVar26 = b_03 * splitter - (b_03 * splitter - b_03);
  dVar30 = b_03 * dVar24;
  dVar31 = b_03 - dVar26;
  dVar19 = dVar31 * dVar20 - (((dVar30 - dVar26 * dVar25) - dVar31 * dVar25) - dVar26 * dVar20);
  dVar23 = dVar40 + dVar19;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar19 - (dVar23 - dVar40));
  dVar19 = dVar30 + dVar23;
  dVar23 = dVar23 - (dVar19 - dVar30);
  dVar21 = -b;
  dVar37 = splitter * dVar21 - (b + splitter * dVar21);
  dVar30 = b_12 * dVar21;
  dVar52 = dVar21 - dVar37;
  dVar36 = dVar42 * dVar52 - (((dVar30 - dVar18 * dVar37) - dVar42 * dVar37) - dVar18 * dVar52);
  dVar32 = dVar36 + dVar40;
  dStack_d45f0 = (dVar40 - (dVar32 - (dVar32 - dVar40))) + (dVar36 - (dVar32 - dVar40));
  dVar36 = dVar23 + dVar32;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar32 - (dVar36 - dVar23));
  dVar40 = dVar19 + dVar36;
  dVar19 = (dVar19 - (dVar40 - (dVar40 - dVar19))) + (dVar36 - (dVar40 - dVar19));
  dVar36 = b_03 * dVar21;
  dVar43 = dVar31 * dVar52 - (((dVar36 - dVar26 * dVar37) - dVar31 * dVar37) - dVar26 * dVar52);
  dVar32 = dVar30 + dVar43;
  dVar30 = (dVar30 - (dVar32 - (dVar32 - dVar30))) + (dVar43 - (dVar32 - dVar30));
  dVar43 = dVar30 + dVar23;
  dStack_d45e8 = (dVar23 - (dVar43 - (dVar43 - dVar23))) + (dVar30 - (dVar43 - dVar23));
  dVar30 = dVar19 + dVar43;
  dVar19 = (dVar19 - (dVar30 - (dVar30 - dVar19))) + (dVar43 - (dVar30 - dVar19));
  dVar23 = dVar40 + dVar30;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar30 - (dVar23 - dVar40));
  dVar30 = dVar36 + dVar32;
  dVar36 = (dVar36 - (dVar30 - (dVar30 - dVar36))) + (dVar32 - (dVar30 - dVar36));
  dVar32 = dVar36 + dVar19;
  dStack_d45e0 = (dVar19 - (dVar32 - (dVar32 - dVar19))) + (dVar36 - (dVar32 - dVar19));
  dVar36 = dVar40 + dVar32;
  dVar40 = (dVar40 - (dVar36 - (dVar36 - dVar40))) + (dVar32 - (dVar36 - dVar40));
  dVar19 = dVar23 + dVar36;
  dVar23 = (dVar23 - (dVar19 - (dVar19 - dVar23))) + (dVar36 - (dVar19 - dVar23));
  dVar36 = dVar30 + dVar40;
  dStack_d45d8 = (dVar40 - (dVar36 - (dVar36 - dVar40))) + (dVar30 - (dVar36 - dVar40));
  dVar40 = dVar23 + dVar36;
  dStack_d45d0 = (dVar23 - (dVar40 - (dVar40 - dVar23))) + (dVar36 - (dVar40 - dVar23));
  dStack_d45c0 = dVar19 + dVar40;
  dStack_d45c8 = (dVar19 - (dStack_d45c0 - (dStack_d45c0 - dVar19))) +
                 (dVar40 - (dStack_d45c0 - dVar19));
  iVar4 = fast_expansion_sum_zeroelim(8,&dStack_d4478,8,&dStack_d45f8,adStack_d4eb8);
  dVar33 = dVar39 * b_15 - (dVar39 * b_15 - b_15);
  dVar55 = b_15 - dVar33;
  dVar40 = b_12 * b_15;
  dStack_d44b8 = dVar42 * dVar55 -
                 (((dVar40 - dVar18 * dVar33) - dVar42 * dVar33) - dVar18 * dVar55);
  dVar30 = b_03 * b_15;
  dVar19 = dVar31 * dVar55 - (((dVar30 - dVar26 * dVar33) - dVar31 * dVar33) - dVar26 * dVar55);
  dVar23 = dVar40 + dVar19;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar19 - (dVar23 - dVar40));
  dVar19 = dVar30 + dVar23;
  dVar23 = dVar23 - (dVar19 - dVar30);
  dVar59 = b_06 * dVar39 - (b_06 * dVar39 - b_06);
  dVar60 = b_06 - dVar59;
  dVar30 = b_12 * b_06;
  dVar36 = dVar42 * dVar60 - (((dVar30 - dVar18 * dVar59) - dVar42 * dVar59) - dVar18 * dVar60);
  dVar32 = dVar36 + dVar40;
  dStack_d44b0 = (dVar40 - (dVar32 - (dVar32 - dVar40))) + (dVar36 - (dVar32 - dVar40));
  dVar36 = dVar23 + dVar32;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar32 - (dVar36 - dVar23));
  dVar40 = dVar19 + dVar36;
  dVar19 = (dVar19 - (dVar40 - (dVar40 - dVar19))) + (dVar36 - (dVar40 - dVar19));
  dVar36 = b_03 * b_06;
  dVar43 = dVar31 * dVar60 - (((dVar36 - dVar26 * dVar59) - dVar31 * dVar59) - dVar26 * dVar60);
  dVar32 = dVar30 + dVar43;
  dVar30 = (dVar30 - (dVar32 - (dVar32 - dVar30))) + (dVar43 - (dVar32 - dVar30));
  dVar43 = dVar30 + dVar23;
  dStack_d44a8 = (dVar23 - (dVar43 - (dVar43 - dVar23))) + (dVar30 - (dVar43 - dVar23));
  dVar30 = dVar19 + dVar43;
  dVar19 = (dVar19 - (dVar30 - (dVar30 - dVar19))) + (dVar43 - (dVar30 - dVar19));
  dVar23 = dVar40 + dVar30;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar30 - (dVar23 - dVar40));
  dVar30 = dVar36 + dVar32;
  dVar36 = (dVar36 - (dVar30 - (dVar30 - dVar36))) + (dVar32 - (dVar30 - dVar36));
  dVar32 = dVar36 + dVar19;
  dStack_d44a0 = (dVar19 - (dVar32 - (dVar32 - dVar19))) + (dVar36 - (dVar32 - dVar19));
  dVar36 = dVar40 + dVar32;
  dVar40 = (dVar40 - (dVar36 - (dVar36 - dVar40))) + (dVar32 - (dVar36 - dVar40));
  dVar19 = dVar23 + dVar36;
  dVar23 = (dVar23 - (dVar19 - (dVar19 - dVar23))) + (dVar36 - (dVar19 - dVar23));
  dVar36 = dVar30 + dVar40;
  dStack_d4498 = (dVar40 - (dVar36 - (dVar36 - dVar40))) + (dVar30 - (dVar36 - dVar40));
  dVar40 = dVar23 + dVar36;
  dStack_d4490 = (dVar23 - (dVar40 - (dVar40 - dVar23))) + (dVar36 - (dVar40 - dVar23));
  dStack_d4480 = dVar19 + dVar40;
  dStack_d4488 = (dVar19 - (dStack_d4480 - (dStack_d4480 - dVar19))) +
                 (dVar40 - (dStack_d4480 - dVar19));
  dVar30 = -b_18;
  dVar32 = b_14 * dVar39 - (b_14 * dVar39 - b_14);
  dVar19 = b_14 - dVar32;
  dVar43 = dVar39 * dVar30 - (b_18 + dVar39 * dVar30);
  dVar27 = dVar30 - dVar43;
  dVar23 = b_14 * dVar30;
  dStack_d4638 = dVar19 * dVar27 -
                 (((dVar23 - dVar32 * dVar43) - dVar19 * dVar43) - dVar32 * dVar27);
  dVar44 = b_05 * dVar39 - (b_05 * dVar39 - b_05);
  dVar53 = b_05 - dVar44;
  dVar22 = b_05 * dVar30;
  dVar40 = dVar53 * dVar27 - (((dVar22 - dVar44 * dVar43) - dVar53 * dVar43) - dVar44 * dVar27);
  dVar36 = dVar23 + dVar40;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar40 - (dVar36 - dVar23));
  dVar40 = dVar22 + dVar36;
  dVar34 = -b_19;
  dVar36 = dVar36 - (dVar40 - dVar22);
  dVar38 = dVar39 * dVar34 - (b_19 + dVar39 * dVar34);
  dVar22 = b_14 * dVar34;
  dVar45 = dVar34 - dVar38;
  dVar28 = dVar19 * dVar45 - (((dVar22 - dVar32 * dVar38) - dVar19 * dVar38) - dVar32 * dVar45);
  dVar35 = dVar28 + dVar23;
  dStack_d4630 = (dVar23 - (dVar35 - (dVar35 - dVar23))) + (dVar28 - (dVar35 - dVar23));
  dVar28 = dVar36 + dVar35;
  dVar36 = (dVar36 - (dVar28 - (dVar28 - dVar36))) + (dVar35 - (dVar28 - dVar36));
  dVar23 = dVar40 + dVar28;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar28 - (dVar23 - dVar40));
  dVar28 = b_05 * dVar34;
  dVar46 = dVar53 * dVar45 - (((dVar28 - dVar44 * dVar38) - dVar53 * dVar38) - dVar44 * dVar45);
  dVar35 = dVar22 + dVar46;
  dVar22 = (dVar22 - (dVar35 - (dVar35 - dVar22))) + (dVar46 - (dVar35 - dVar22));
  dVar46 = dVar22 + dVar36;
  dStack_d4628 = (dVar36 - (dVar46 - (dVar46 - dVar36))) + (dVar22 - (dVar46 - dVar36));
  dVar22 = dVar40 + dVar46;
  dVar40 = (dVar40 - (dVar22 - (dVar22 - dVar40))) + (dVar46 - (dVar22 - dVar40));
  dVar36 = dVar23 + dVar22;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar22 - (dVar36 - dVar23));
  dVar22 = dVar28 + dVar35;
  dVar28 = (dVar28 - (dVar22 - (dVar22 - dVar28))) + (dVar35 - (dVar22 - dVar28));
  dVar35 = dVar28 + dVar40;
  dStack_d4620 = (dVar40 - (dVar35 - (dVar35 - dVar40))) + (dVar28 - (dVar35 - dVar40));
  dVar28 = dVar23 + dVar35;
  dVar23 = (dVar23 - (dVar28 - (dVar28 - dVar23))) + (dVar35 - (dVar28 - dVar23));
  dVar40 = dVar36 + dVar28;
  dVar36 = (dVar36 - (dVar40 - (dVar40 - dVar36))) + (dVar28 - (dVar40 - dVar36));
  dVar28 = dVar22 + dVar23;
  dStack_d4618 = (dVar23 - (dVar28 - (dVar28 - dVar23))) + (dVar22 - (dVar28 - dVar23));
  dVar23 = dVar36 + dVar28;
  dStack_d4610 = (dVar36 - (dVar23 - (dVar23 - dVar36))) + (dVar28 - (dVar23 - dVar36));
  dStack_d4600 = dVar40 + dVar23;
  dStack_d4608 = (dVar40 - (dStack_d4600 - (dStack_d4600 - dVar40))) +
                 (dVar23 - (dStack_d4600 - dVar40));
  iVar5 = fast_expansion_sum_zeroelim(8,&dStack_d44b8,8,&dStack_d4638,adStack_d4f38);
  dVar46 = dVar39 * b_09 - (dVar39 * b_09 - b_09);
  dVar47 = b_09 - dVar46;
  dVar23 = b_14 * b_09;
  dStack_d44f8 = dVar19 * dVar47 -
                 (((dVar23 - dVar32 * dVar46) - dVar19 * dVar46) - dVar32 * dVar47);
  dVar22 = b_05 * b_09;
  dVar40 = dVar53 * dVar47 - (((dVar22 - dVar44 * dVar46) - dVar53 * dVar46) - dVar44 * dVar47);
  dVar36 = dVar23 + dVar40;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar40 - (dVar36 - dVar23));
  dVar40 = dVar22 + dVar36;
  dVar36 = dVar36 - (dVar40 - dVar22);
  dVar48 = b_01 * dVar39 - (b_01 * dVar39 - b_01);
  dVar56 = b_01 - dVar48;
  dVar22 = b_14 * b_01;
  dVar28 = dVar19 * dVar56 - (((dVar22 - dVar32 * dVar48) - dVar19 * dVar48) - dVar32 * dVar56);
  dVar35 = dVar28 + dVar23;
  dStack_d44f0 = (dVar23 - (dVar35 - (dVar35 - dVar23))) + (dVar28 - (dVar35 - dVar23));
  dVar28 = dVar36 + dVar35;
  dVar36 = (dVar36 - (dVar28 - (dVar28 - dVar36))) + (dVar35 - (dVar28 - dVar36));
  dVar23 = dVar40 + dVar28;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar28 - (dVar23 - dVar40));
  dVar28 = b_05 * b_01;
  dVar49 = dVar53 * dVar56 - (((dVar28 - dVar44 * dVar48) - dVar53 * dVar48) - dVar44 * dVar56);
  dVar35 = dVar22 + dVar49;
  dVar22 = (dVar22 - (dVar35 - (dVar35 - dVar22))) + (dVar49 - (dVar35 - dVar22));
  dVar49 = dVar22 + dVar36;
  dStack_d44e8 = (dVar36 - (dVar49 - (dVar49 - dVar36))) + (dVar22 - (dVar49 - dVar36));
  dVar22 = dVar40 + dVar49;
  dVar40 = (dVar40 - (dVar22 - (dVar22 - dVar40))) + (dVar49 - (dVar22 - dVar40));
  dVar36 = dVar23 + dVar22;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar22 - (dVar36 - dVar23));
  dVar22 = dVar28 + dVar35;
  dVar28 = (dVar28 - (dVar22 - (dVar22 - dVar28))) + (dVar35 - (dVar22 - dVar28));
  dVar35 = dVar28 + dVar40;
  dStack_d44e0 = (dVar40 - (dVar35 - (dVar35 - dVar40))) + (dVar28 - (dVar35 - dVar40));
  dVar28 = dVar23 + dVar35;
  dVar23 = (dVar23 - (dVar28 - (dVar28 - dVar23))) + (dVar35 - (dVar28 - dVar23));
  dVar40 = dVar36 + dVar28;
  dVar36 = (dVar36 - (dVar40 - (dVar40 - dVar36))) + (dVar28 - (dVar40 - dVar36));
  dVar28 = dVar22 + dVar23;
  dStack_d44d8 = (dVar23 - (dVar28 - (dVar28 - dVar23))) + (dVar22 - (dVar28 - dVar23));
  dVar23 = dVar36 + dVar28;
  dStack_d44d0 = (dVar36 - (dVar23 - (dVar23 - dVar36))) + (dVar28 - (dVar23 - dVar36));
  dStack_d44c0 = dVar40 + dVar23;
  dStack_d44c8 = (dVar40 - (dStack_d44c0 - (dStack_d44c0 - dVar40))) +
                 (dVar23 - (dStack_d44c0 - dVar40));
  dVar40 = -b_06;
  dVar35 = -b_15;
  dVar22 = dVar39 * b_17 - (dVar39 * b_17 - b_17);
  dVar58 = b_17 - dVar22;
  dVar28 = dVar39 * dVar35 - (b_15 + dVar39 * dVar35);
  dVar23 = dVar35 - dVar28;
  dVar36 = b_17 * dVar35;
  dStack_d4678 = dVar58 * dVar23 -
                 (((dVar36 - dVar22 * dVar28) - dVar58 * dVar28) - dVar22 * dVar23);
  dVar50 = b_08 * dVar39 - (b_08 * dVar39 - b_08);
  dVar57 = b_08 - dVar50;
  dVar35 = dVar35 * b_08;
  dVar23 = dVar23 * dVar57 - (((dVar35 - dVar50 * dVar28) - dVar28 * dVar57) - dVar50 * dVar23);
  dVar28 = dVar36 + dVar23;
  dVar36 = (dVar36 - (dVar28 - (dVar28 - dVar36))) + (dVar23 - (dVar28 - dVar36));
  dVar23 = dVar35 + dVar28;
  dVar28 = dVar28 - (dVar23 - dVar35);
  dVar49 = dVar39 * dVar40 - (b_06 + dVar39 * dVar40);
  dVar61 = b_17 * dVar40;
  dVar35 = dVar40 - dVar49;
  dVar54 = dVar58 * dVar35 - (((dVar61 - dVar22 * dVar49) - dVar58 * dVar49) - dVar22 * dVar35);
  dVar51 = dVar54 + dVar36;
  dStack_d4670 = (dVar36 - (dVar51 - (dVar51 - dVar36))) + (dVar54 - (dVar51 - dVar36));
  dVar54 = dVar28 + dVar51;
  dVar28 = (dVar28 - (dVar54 - (dVar54 - dVar28))) + (dVar51 - (dVar54 - dVar28));
  dVar36 = dVar23 + dVar54;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar54 - (dVar36 - dVar23));
  dVar40 = dVar40 * b_08;
  dVar35 = dVar35 * dVar57 - (((dVar40 - dVar50 * dVar49) - dVar49 * dVar57) - dVar50 * dVar35);
  dVar51 = dVar61 + dVar35;
  dVar35 = (dVar61 - (dVar51 - (dVar51 - dVar61))) + (dVar35 - (dVar51 - dVar61));
  dVar49 = dVar35 + dVar28;
  dStack_d4668 = (dVar28 - (dVar49 - (dVar49 - dVar28))) + (dVar35 - (dVar49 - dVar28));
  dVar35 = dVar23 + dVar49;
  dVar23 = (dVar23 - (dVar35 - (dVar35 - dVar23))) + (dVar49 - (dVar35 - dVar23));
  dVar28 = dVar36 + dVar35;
  dVar36 = (dVar36 - (dVar28 - (dVar28 - dVar36))) + (dVar35 - (dVar28 - dVar36));
  dVar35 = dVar40 + dVar51;
  dVar40 = (dVar40 - (dVar35 - (dVar35 - dVar40))) + (dVar51 - (dVar35 - dVar40));
  dVar49 = dVar40 + dVar23;
  dStack_d4660 = (dVar23 - (dVar49 - (dVar49 - dVar23))) + (dVar40 - (dVar49 - dVar23));
  dVar23 = dVar36 + dVar49;
  dVar36 = (dVar36 - (dVar23 - (dVar23 - dVar36))) + (dVar49 - (dVar23 - dVar36));
  dVar40 = dVar28 + dVar23;
  dVar28 = (dVar28 - (dVar40 - (dVar40 - dVar28))) + (dVar23 - (dVar40 - dVar28));
  dVar23 = dVar35 + dVar36;
  dStack_d4658 = (dVar36 - (dVar23 - (dVar23 - dVar36))) + (dVar35 - (dVar23 - dVar36));
  dVar36 = dVar28 + dVar23;
  dStack_d4650 = (dVar28 - (dVar36 - (dVar36 - dVar28))) + (dVar23 - (dVar36 - dVar28));
  dStack_d4640 = dVar40 + dVar36;
  dStack_d4648 = (dVar40 - (dStack_d4640 - (dStack_d4640 - dVar40))) +
                 (dVar36 - (dStack_d4640 - dVar40));
  iVar6 = fast_expansion_sum_zeroelim(8,&dStack_d44f8,8,&dStack_d4678,adStack_d47b8);
  dVar36 = b_11 * dVar39 - (b_11 * dVar39 - b_11);
  dVar40 = b_11 - dVar36;
  dVar23 = b_11 * b_17;
  dStack_d4538 = dVar58 * dVar40 -
                 (((dVar23 - dVar22 * dVar36) - dVar58 * dVar36) - dVar22 * dVar40);
  dVar28 = b_11 * b_08;
  dVar40 = dVar40 * dVar57 - (((dVar28 - dVar50 * dVar36) - dVar36 * dVar57) - dVar50 * dVar40);
  dVar36 = dVar23 + dVar40;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar40 - (dVar36 - dVar23));
  dVar40 = dVar28 + dVar36;
  dVar36 = dVar36 - (dVar40 - dVar28);
  dVar51 = b * dVar39 - (b * dVar39 - b);
  dVar49 = b - dVar51;
  dVar28 = b * b_17;
  dVar35 = dVar58 * dVar49 - (((dVar28 - dVar22 * dVar51) - dVar58 * dVar51) - dVar22 * dVar49);
  dVar54 = dVar35 + dVar23;
  dStack_d4530 = (dVar23 - (dVar54 - (dVar54 - dVar23))) + (dVar35 - (dVar54 - dVar23));
  dVar35 = dVar36 + dVar54;
  dVar36 = (dVar36 - (dVar35 - (dVar35 - dVar36))) + (dVar54 - (dVar35 - dVar36));
  dVar23 = dVar40 + dVar35;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar35 - (dVar23 - dVar40));
  dVar35 = b * b_08;
  dVar49 = dVar49 * dVar57 - (((dVar35 - dVar50 * dVar51) - dVar51 * dVar57) - dVar50 * dVar49);
  dVar51 = dVar28 + dVar49;
  dVar28 = (dVar28 - (dVar51 - (dVar51 - dVar28))) + (dVar49 - (dVar51 - dVar28));
  dVar49 = dVar28 + dVar36;
  dStack_d4528 = (dVar36 - (dVar49 - (dVar49 - dVar36))) + (dVar28 - (dVar49 - dVar36));
  dVar28 = dVar40 + dVar49;
  dVar40 = (dVar40 - (dVar28 - (dVar28 - dVar40))) + (dVar49 - (dVar28 - dVar40));
  dVar36 = dVar23 + dVar28;
  dVar23 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar28 - (dVar36 - dVar23));
  dVar28 = dVar35 + dVar51;
  dVar35 = (dVar35 - (dVar28 - (dVar28 - dVar35))) + (dVar51 - (dVar28 - dVar35));
  dVar49 = dVar35 + dVar40;
  dStack_d4520 = (dVar40 - (dVar49 - (dVar49 - dVar40))) + (dVar35 - (dVar49 - dVar40));
  dVar35 = dVar23 + dVar49;
  dVar23 = (dVar23 - (dVar35 - (dVar35 - dVar23))) + (dVar49 - (dVar35 - dVar23));
  dVar40 = dVar36 + dVar35;
  dVar36 = (dVar36 - (dVar40 - (dVar40 - dVar36))) + (dVar35 - (dVar40 - dVar36));
  dVar35 = dVar28 + dVar23;
  dStack_d4518 = (dVar23 - (dVar35 - (dVar35 - dVar23))) + (dVar28 - (dVar35 - dVar23));
  dVar23 = dVar36 + dVar35;
  dStack_d4510 = (dVar36 - (dVar23 - (dVar23 - dVar36))) + (dVar35 - (dVar23 - dVar36));
  dStack_d4500 = dVar40 + dVar23;
  dStack_d4508 = (dVar40 - (dStack_d4500 - (dStack_d4500 - dVar40))) +
                 (dVar23 - (dStack_d4500 - dVar40));
  dVar40 = -b_01;
  dVar35 = -b_09;
  dVar28 = dVar39 * dVar35 - (b_09 + dVar39 * dVar35);
  dVar23 = dVar35 - dVar28;
  dVar36 = b_10 * dVar35;
  dStack_d46b8 = dVar17 * dVar23 -
                 (((dVar36 - dVar29 * dVar28) - dVar17 * dVar28) - dVar29 * dVar23);
  dVar35 = dVar35 * b_20;
  dVar23 = dVar23 * dVar16 - (((dVar35 - dVar41 * dVar28) - dVar28 * dVar16) - dVar41 * dVar23);
  dVar28 = dVar36 + dVar23;
  dVar36 = (dVar36 - (dVar28 - (dVar28 - dVar36))) + (dVar23 - (dVar28 - dVar36));
  dVar23 = dVar35 + dVar28;
  dVar28 = dVar28 - (dVar23 - dVar35);
  dVar61 = dVar39 * dVar40 - (b_01 + dVar39 * dVar40);
  dVar49 = dVar40 - dVar61;
  dVar35 = b_10 * dVar40;
  dVar39 = dVar17 * dVar49 - (((dVar35 - dVar29 * dVar61) - dVar17 * dVar61) - dVar29 * dVar49);
  dVar54 = dVar39 + dVar36;
  dStack_d46b0 = (dVar36 - (dVar54 - (dVar54 - dVar36))) + (dVar39 - (dVar54 - dVar36));
  dVar51 = dVar28 + dVar54;
  dVar36 = (dVar28 - (dVar51 - (dVar51 - dVar28))) + (dVar54 - (dVar51 - dVar28));
  dVar39 = dVar23 + dVar51;
  dVar23 = (dVar23 - (dVar39 - (dVar39 - dVar23))) + (dVar51 - (dVar39 - dVar23));
  dVar40 = dVar40 * b_20;
  dVar28 = dVar49 * dVar16 - (((dVar40 - dVar41 * dVar61) - dVar61 * dVar16) - dVar41 * dVar49);
  dVar49 = dVar35 + dVar28;
  dVar28 = (dVar35 - (dVar49 - (dVar49 - dVar35))) + (dVar28 - (dVar49 - dVar35));
  dVar35 = dVar28 + dVar36;
  dStack_d46a8 = (dVar36 - (dVar35 - (dVar35 - dVar36))) + (dVar28 - (dVar35 - dVar36));
  dVar28 = dVar23 + dVar35;
  dVar23 = (dVar23 - (dVar28 - (dVar28 - dVar23))) + (dVar35 - (dVar28 - dVar23));
  dVar36 = dVar39 + dVar28;
  dVar39 = (dVar39 - (dVar36 - (dVar36 - dVar39))) + (dVar28 - (dVar36 - dVar39));
  dVar28 = dVar40 + dVar49;
  dVar40 = (dVar40 - (dVar28 - (dVar28 - dVar40))) + (dVar49 - (dVar28 - dVar40));
  dVar35 = dVar40 + dVar23;
  dStack_d46a0 = (dVar23 - (dVar35 - (dVar35 - dVar23))) + (dVar40 - (dVar35 - dVar23));
  dVar23 = dVar39 + dVar35;
  dVar39 = (dVar39 - (dVar23 - (dVar23 - dVar39))) + (dVar35 - (dVar23 - dVar39));
  dVar40 = dVar36 + dVar23;
  dVar36 = (dVar36 - (dVar40 - (dVar40 - dVar36))) + (dVar23 - (dVar40 - dVar36));
  dVar23 = dVar28 + dVar39;
  dStack_d4698 = (dVar39 - (dVar23 - (dVar23 - dVar39))) + (dVar28 - (dVar23 - dVar39));
  dVar39 = dVar36 + dVar23;
  dStack_d4690 = (dVar36 - (dVar39 - (dVar39 - dVar36))) + (dVar23 - (dVar39 - dVar36));
  dStack_d4680 = dVar40 + dVar39;
  dStack_d4688 = (dVar40 - (dStack_d4680 - (dStack_d4680 - dVar40))) +
                 (dVar39 - (dStack_d4680 - dVar40));
  iVar7 = fast_expansion_sum_zeroelim(8,&dStack_d4538,8,&dStack_d46b8,adStack_d4fb8);
  dVar23 = b_10 * b_15;
  dStack_d4578 = dVar17 * dVar55 -
                 (((dVar23 - dVar29 * dVar33) - dVar17 * dVar33) - dVar29 * dVar55);
  dVar36 = b_20 * b_15;
  dVar40 = dVar55 * dVar16 - (((dVar36 - dVar41 * dVar33) - dVar33 * dVar16) - dVar41 * dVar55);
  dVar39 = dVar23 + dVar40;
  dVar23 = (dVar23 - (dVar39 - (dVar39 - dVar23))) + (dVar40 - (dVar39 - dVar23));
  dVar40 = dVar36 + dVar39;
  dVar39 = dVar39 - (dVar40 - dVar36);
  dVar36 = b_10 * b_06;
  dVar17 = dVar17 * dVar60 - (((dVar36 - dVar29 * dVar59) - dVar17 * dVar59) - dVar29 * dVar60);
  dVar29 = dVar17 + dVar23;
  dStack_d4570 = (dVar23 - (dVar29 - (dVar29 - dVar23))) + (dVar17 - (dVar29 - dVar23));
  dVar17 = dVar39 + dVar29;
  dVar23 = (dVar39 - (dVar17 - (dVar17 - dVar39))) + (dVar29 - (dVar17 - dVar39));
  dVar29 = dVar40 + dVar17;
  dVar40 = (dVar40 - (dVar29 - (dVar29 - dVar40))) + (dVar17 - (dVar29 - dVar40));
  dVar17 = b_20 * b_06;
  dVar39 = dVar60 * dVar16 - (((dVar17 - dVar41 * dVar59) - dVar59 * dVar16) - dVar41 * dVar60);
  dVar16 = dVar36 + dVar39;
  dVar39 = (dVar36 - (dVar16 - (dVar16 - dVar36))) + (dVar39 - (dVar16 - dVar36));
  dVar36 = dVar39 + dVar23;
  dStack_d4568 = (dVar23 - (dVar36 - (dVar36 - dVar23))) + (dVar39 - (dVar36 - dVar23));
  dVar39 = dVar40 + dVar36;
  dVar40 = (dVar40 - (dVar39 - (dVar39 - dVar40))) + (dVar36 - (dVar39 - dVar40));
  dVar23 = dVar29 + dVar39;
  dVar29 = (dVar29 - (dVar23 - (dVar23 - dVar29))) + (dVar39 - (dVar23 - dVar29));
  dVar39 = dVar17 + dVar16;
  dVar16 = (dVar17 - (dVar39 - (dVar39 - dVar17))) + (dVar16 - (dVar39 - dVar17));
  dVar36 = dVar16 + dVar40;
  dStack_d4560 = (dVar40 - (dVar36 - (dVar36 - dVar40))) + (dVar16 - (dVar36 - dVar40));
  dVar16 = dVar29 + dVar36;
  dVar29 = (dVar29 - (dVar16 - (dVar16 - dVar29))) + (dVar36 - (dVar16 - dVar29));
  dVar40 = dVar23 + dVar16;
  dVar23 = (dVar23 - (dVar40 - (dVar40 - dVar23))) + (dVar16 - (dVar40 - dVar23));
  dVar16 = dVar39 + dVar29;
  dStack_d4558 = (dVar29 - (dVar16 - (dVar16 - dVar29))) + (dVar39 - (dVar16 - dVar29));
  dVar29 = dVar23 + dVar16;
  dStack_d4550 = (dVar23 - (dVar29 - (dVar29 - dVar23))) + (dVar16 - (dVar29 - dVar23));
  dStack_d4540 = dVar40 + dVar29;
  dStack_d4548 = (dVar40 - (dStack_d4540 - (dStack_d4540 - dVar40))) +
                 (dVar29 - (dStack_d4540 - dVar40));
  dVar40 = b_14 * dVar24;
  dStack_d46f8 = dVar19 * dVar20 -
                 (((dVar40 - dVar32 * dVar25) - dVar19 * dVar25) - dVar32 * dVar20);
  dVar24 = dVar24 * b_05;
  dVar29 = dVar20 * dVar53 - (((dVar24 - dVar44 * dVar25) - dVar25 * dVar53) - dVar44 * dVar20);
  dVar23 = dVar40 + dVar29;
  dVar29 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar29 - (dVar23 - dVar40));
  dVar40 = dVar24 + dVar23;
  dVar23 = dVar23 - (dVar40 - dVar24);
  dVar39 = b_14 * dVar21;
  dVar16 = dVar19 * dVar52 - (((dVar39 - dVar32 * dVar37) - dVar19 * dVar37) - dVar32 * dVar52);
  dVar19 = dVar16 + dVar29;
  dStack_d46f0 = (dVar29 - (dVar19 - (dVar19 - dVar29))) + (dVar16 - (dVar19 - dVar29));
  dVar16 = dVar23 + dVar19;
  dVar23 = (dVar23 - (dVar16 - (dVar16 - dVar23))) + (dVar19 - (dVar16 - dVar23));
  dVar29 = dVar40 + dVar16;
  dVar19 = (dVar40 - (dVar29 - (dVar29 - dVar40))) + (dVar16 - (dVar29 - dVar40));
  dVar21 = dVar21 * b_05;
  dVar40 = dVar53 * dVar52 - (((dVar21 - dVar44 * dVar37) - dVar37 * dVar53) - dVar44 * dVar52);
  dVar16 = dVar39 + dVar40;
  dVar40 = (dVar39 - (dVar16 - (dVar16 - dVar39))) + (dVar40 - (dVar16 - dVar39));
  dVar39 = dVar40 + dVar23;
  dStack_d46e8 = (dVar23 - (dVar39 - (dVar39 - dVar23))) + (dVar40 - (dVar39 - dVar23));
  dVar40 = dVar19 + dVar39;
  dVar19 = (dVar19 - (dVar40 - (dVar40 - dVar19))) + (dVar39 - (dVar40 - dVar19));
  dVar23 = dVar29 + dVar40;
  dVar40 = (dVar29 - (dVar23 - (dVar23 - dVar29))) + (dVar40 - (dVar23 - dVar29));
  dVar39 = dVar21 + dVar16;
  dVar16 = (dVar21 - (dVar39 - (dVar39 - dVar21))) + (dVar16 - (dVar39 - dVar21));
  dVar29 = dVar16 + dVar19;
  dStack_d46e0 = (dVar19 - (dVar29 - (dVar29 - dVar19))) + (dVar16 - (dVar29 - dVar19));
  dVar16 = dVar40 + dVar29;
  dVar40 = (dVar40 - (dVar16 - (dVar16 - dVar40))) + (dVar29 - (dVar16 - dVar40));
  dVar19 = dVar23 + dVar16;
  dVar29 = (dVar23 - (dVar19 - (dVar19 - dVar23))) + (dVar16 - (dVar19 - dVar23));
  dVar23 = dVar39 + dVar40;
  dStack_d46d8 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar39 - (dVar23 - dVar40));
  dVar40 = dVar29 + dVar23;
  dStack_d46d0 = (dVar29 - (dVar40 - (dVar40 - dVar29))) + (dVar23 - (dVar40 - dVar29));
  dStack_d46c0 = dVar19 + dVar40;
  dStack_d46c8 = (dVar19 - (dStack_d46c0 - (dStack_d46c0 - dVar19))) +
                 (dVar40 - (dStack_d46c0 - dVar19));
  iVar8 = fast_expansion_sum_zeroelim(8,&dStack_d4578,8,&dStack_d46f8,adStack_d5038);
  dVar40 = b_12 * b_09;
  dStack_d45b8 = dVar42 * dVar47 -
                 (((dVar40 - dVar18 * dVar46) - dVar42 * dVar46) - dVar18 * dVar47);
  dVar23 = b_03 * b_09;
  dVar19 = dVar47 * dVar31 - (((dVar23 - dVar26 * dVar46) - dVar46 * dVar31) - dVar26 * dVar47);
  dVar29 = dVar40 + dVar19;
  dVar40 = (dVar40 - (dVar29 - (dVar29 - dVar40))) + (dVar19 - (dVar29 - dVar40));
  dVar19 = dVar23 + dVar29;
  dVar29 = dVar29 - (dVar19 - dVar23);
  dVar23 = b_12 * b_01;
  dVar39 = dVar42 * dVar56 - (((dVar23 - dVar18 * dVar48) - dVar42 * dVar48) - dVar18 * dVar56);
  dVar18 = dVar39 + dVar40;
  dStack_d45b0 = (dVar40 - (dVar18 - (dVar18 - dVar40))) + (dVar39 - (dVar18 - dVar40));
  dVar39 = dVar29 + dVar18;
  dVar29 = (dVar29 - (dVar39 - (dVar39 - dVar29))) + (dVar18 - (dVar39 - dVar29));
  dVar40 = dVar19 + dVar39;
  dVar19 = (dVar19 - (dVar40 - (dVar40 - dVar19))) + (dVar39 - (dVar40 - dVar19));
  dVar39 = b_03 * b_01;
  dVar18 = dVar56 * dVar31 - (((dVar39 - dVar26 * dVar48) - dVar48 * dVar31) - dVar26 * dVar56);
  dVar16 = dVar23 + dVar18;
  dVar18 = (dVar23 - (dVar16 - (dVar16 - dVar23))) + (dVar18 - (dVar16 - dVar23));
  dVar23 = dVar18 + dVar29;
  dStack_d45a8 = (dVar29 - (dVar23 - (dVar23 - dVar29))) + (dVar18 - (dVar23 - dVar29));
  dVar18 = dVar19 + dVar23;
  dVar19 = (dVar19 - (dVar18 - (dVar18 - dVar19))) + (dVar23 - (dVar18 - dVar19));
  dVar29 = dVar40 + dVar18;
  dVar40 = (dVar40 - (dVar29 - (dVar29 - dVar40))) + (dVar18 - (dVar29 - dVar40));
  dVar18 = dVar39 + dVar16;
  dVar23 = (dVar39 - (dVar18 - (dVar18 - dVar39))) + (dVar16 - (dVar18 - dVar39));
  dVar39 = dVar23 + dVar19;
  dStack_d45a0 = (dVar19 - (dVar39 - (dVar39 - dVar19))) + (dVar23 - (dVar39 - dVar19));
  dVar23 = dVar40 + dVar39;
  dVar40 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar39 - (dVar23 - dVar40));
  dVar19 = dVar29 + dVar23;
  dVar29 = (dVar29 - (dVar19 - (dVar19 - dVar29))) + (dVar23 - (dVar19 - dVar29));
  dVar23 = dVar18 + dVar40;
  dStack_d4598 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar18 - (dVar23 - dVar40));
  dVar40 = dVar29 + dVar23;
  dStack_d4590 = (dVar29 - (dVar40 - (dVar40 - dVar29))) + (dVar23 - (dVar40 - dVar29));
  dStack_d4580 = dVar19 + dVar40;
  dStack_d4588 = (dVar19 - (dStack_d4580 - (dStack_d4580 - dVar19))) +
                 (dVar40 - (dStack_d4580 - dVar19));
  dVar19 = b_17 * dVar30;
  dStack_d4738 = dVar58 * dVar27 -
                 (((dVar19 - dVar22 * dVar43) - dVar58 * dVar43) - dVar22 * dVar27);
  dVar30 = dVar30 * b_08;
  dVar40 = dVar27 * dVar57 - (((dVar30 - dVar50 * dVar43) - dVar43 * dVar57) - dVar50 * dVar27);
  dVar29 = dVar19 + dVar40;
  dVar40 = (dVar19 - (dVar29 - (dVar29 - dVar19))) + (dVar40 - (dVar29 - dVar19));
  dVar19 = dVar30 + dVar29;
  dVar29 = dVar29 - (dVar19 - dVar30);
  dVar18 = b_17 * dVar34;
  dVar39 = dVar58 * dVar45 - (((dVar18 - dVar22 * dVar38) - dVar58 * dVar38) - dVar22 * dVar45);
  dVar23 = dVar39 + dVar40;
  dStack_d4730 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar39 - (dVar23 - dVar40));
  dVar39 = dVar29 + dVar23;
  dVar29 = (dVar29 - (dVar39 - (dVar39 - dVar29))) + (dVar23 - (dVar39 - dVar29));
  dVar40 = dVar19 + dVar39;
  dVar19 = (dVar19 - (dVar40 - (dVar40 - dVar19))) + (dVar39 - (dVar40 - dVar19));
  dVar34 = dVar34 * b_08;
  dVar39 = dVar57 * dVar45 - (((dVar34 - dVar50 * dVar38) - dVar38 * dVar57) - dVar50 * dVar45);
  dVar23 = dVar18 + dVar39;
  dVar18 = (dVar18 - (dVar23 - (dVar23 - dVar18))) + (dVar39 - (dVar23 - dVar18));
  dVar39 = dVar18 + dVar29;
  dStack_d4728 = (dVar29 - (dVar39 - (dVar39 - dVar29))) + (dVar18 - (dVar39 - dVar29));
  dVar18 = dVar19 + dVar39;
  dVar19 = (dVar19 - (dVar18 - (dVar18 - dVar19))) + (dVar39 - (dVar18 - dVar19));
  dVar29 = dVar40 + dVar18;
  dVar40 = (dVar40 - (dVar29 - (dVar29 - dVar40))) + (dVar18 - (dVar29 - dVar40));
  dVar18 = dVar34 + dVar23;
  dVar39 = (dVar34 - (dVar18 - (dVar18 - dVar34))) + (dVar23 - (dVar18 - dVar34));
  dVar23 = dVar39 + dVar19;
  dStack_d4720 = (dVar19 - (dVar23 - (dVar23 - dVar19))) + (dVar39 - (dVar23 - dVar19));
  dVar39 = dVar40 + dVar23;
  dVar40 = (dVar40 - (dVar39 - (dVar39 - dVar40))) + (dVar23 - (dVar39 - dVar40));
  dVar19 = dVar29 + dVar39;
  dVar29 = (dVar29 - (dVar19 - (dVar19 - dVar29))) + (dVar39 - (dVar19 - dVar29));
  dVar23 = dVar18 + dVar40;
  dStack_d4718 = (dVar40 - (dVar23 - (dVar23 - dVar40))) + (dVar18 - (dVar23 - dVar40));
  dVar40 = dVar29 + dVar23;
  dStack_d4710 = (dVar29 - (dVar40 - (dVar40 - dVar29))) + (dVar23 - (dVar40 - dVar29));
  dStack_d4700 = dVar19 + dVar40;
  dStack_d4708 = (dVar19 - (dStack_d4700 - (dStack_d4700 - dVar19))) +
                 (dVar40 - (dStack_d4700 - dVar19));
  iVar9 = fast_expansion_sum_zeroelim(8,&dStack_d45b8,8,&dStack_d4738,adStack_d4838);
  dStack_d5278 = -b_04;
  iVar10 = scale_expansion_zeroelim(iVar6,adStack_d47b8,-b_04,adStack_d4e38);
  dStack_d5288 = -b_13;
  iVar11 = scale_expansion_zeroelim(iVar6,adStack_d47b8,-b_13,adStack_d4938);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_d4e38,iVar11,adStack_d4938,adStack_d4b38);
  iVar11 = scale_expansion_zeroelim(iVar9,adStack_d4838,b_07,adStack_d4e38);
  iVar12 = scale_expansion_zeroelim(iVar9,adStack_d4838,b_16,adStack_d4938);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_d4e38,iVar12,adStack_d4938,adStack_d4d38);
  dStack_d51c8 = -dVar3;
  iVar12 = scale_expansion_zeroelim(iVar5,adStack_d4f38,-dVar3,adStack_d4e38);
  dStack_d51d8 = -b_02;
  iVar13 = scale_expansion_zeroelim(iVar5,adStack_d4f38,-b_02,adStack_d4938);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_d4e38,iVar13,adStack_d4938,adStack_d3e38);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_d4b38,iVar11,adStack_d4d38,adStack_d3c38);
  iVar10 = fast_expansion_sum_zeroelim(iVar12,adStack_d3e38,iVar10,adStack_d3c38,adStack_d4438);
  iVar11 = scale_expansion_zeroelim(iVar10,adStack_d4438,b_20,adStack_c6c38);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_c6c38,b_20,adStack_c8438);
  iVar12 = scale_expansion_zeroelim(iVar10,adStack_d4438,b_10,adStack_cd838);
  uVar14 = scale_expansion_zeroelim(iVar12,adStack_cd838,b_20,adStack_cf038);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_cf038[uVar15] = adStack_cf038[uVar15] + adStack_cf038[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  dVar1 = ((dVar1 - b_00) - dVar2) + (dVar1 - (b_00 + (dVar1 - b_00)));
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_cd838,b_10,adStack_c3038);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_c8438,uVar14,adStack_cf038,adStack_b2838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_b2838,iVar12,adStack_c3038,adStack_bd038);
  iVar12 = scale_expansion_zeroelim(iVar10,adStack_d4438,b,adStack_c9038);
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_c9038,b,adStack_ca838);
  iVar13 = scale_expansion_zeroelim(iVar10,adStack_d4438,b_11,adStack_cfc38);
  uVar14 = scale_expansion_zeroelim(iVar13,adStack_cfc38,b,adStack_d1438);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d1438[uVar15] = adStack_d1438[uVar15] + adStack_d1438[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_cfc38,b_11,adStack_c4838);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_ca838,uVar14,adStack_d1438,adStack_b5838);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_b5838,iVar13,adStack_c4838,adStack_c1838);
  iVar13 = scale_expansion_zeroelim(iVar10,adStack_d4438,b_00,adStack_cb438);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_cb438,b_00,adStack_ccc38);
  iVar10 = scale_expansion_zeroelim(iVar10,adStack_d4438,dVar1,adStack_d2038);
  uVar14 = scale_expansion_zeroelim(iVar10,adStack_d2038,b_00,adStack_d3838);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d3838[uVar15] = adStack_d3838[uVar15] + adStack_d3838[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar10 = scale_expansion_zeroelim(iVar10,adStack_d2038,dVar1,adStack_c6038);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_ccc38,uVar14,adStack_d3838,adStack_b8838);
  iVar10 = fast_expansion_sum_zeroelim(iVar13,adStack_b8838,iVar10,adStack_c6038,adStack_af838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_bd038,iVar12,adStack_c1838,adStack_ab038);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_af838,iVar11,adStack_ab038,adStack_87038);
  iVar11 = scale_expansion_zeroelim(iVar7,adStack_d4fb8,b_07,adStack_d4e38);
  iVar12 = scale_expansion_zeroelim(iVar7,adStack_d4fb8,b_16,adStack_d4938);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_d4e38,iVar12,adStack_d4938,adStack_d4b38);
  iVar12 = scale_expansion_zeroelim(iVar8,adStack_d5038,dVar3,adStack_d4e38);
  iVar13 = scale_expansion_zeroelim(iVar8,adStack_d5038,b_02,adStack_d4938);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_d4e38,iVar13,adStack_d4938,adStack_d4d38);
  iVar13 = scale_expansion_zeroelim(iVar6,adStack_d47b8,b_00,adStack_d4e38);
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_d47b8,dVar1,adStack_d4938);
  iVar6 = fast_expansion_sum_zeroelim(iVar13,adStack_d4e38,iVar6,adStack_d4938,adStack_d3e38);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_d4b38,iVar12,adStack_d4d38,adStack_d3c38);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,adStack_d3e38,iVar11,adStack_d3c38,adStack_d4438);
  iVar11 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_03,adStack_c6c38);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_c6c38,b_03,adStack_c8438);
  iVar12 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_12,adStack_cd838);
  uVar14 = scale_expansion_zeroelim(iVar12,adStack_cd838,b_03,adStack_cf038);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_cf038[uVar15] = adStack_cf038[uVar15] + adStack_cf038[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_cd838,b_12,adStack_c3038);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_c8438,uVar14,adStack_cf038,adStack_b2838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_b2838,iVar12,adStack_c3038,adStack_bd038);
  iVar12 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_19,adStack_c9038);
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_c9038,b_19,adStack_ca838);
  iVar13 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_18,adStack_cfc38);
  uVar14 = scale_expansion_zeroelim(iVar13,adStack_cfc38,b_19,adStack_d1438);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d1438[uVar15] = adStack_d1438[uVar15] + adStack_d1438[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_cfc38,b_18,adStack_c4838);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_ca838,uVar14,adStack_d1438,adStack_b5838);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_b5838,iVar13,adStack_c4838,adStack_c1838);
  iVar13 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_04,adStack_cb438);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_cb438,b_04,adStack_ccc38);
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_d4438,b_13,adStack_d2038);
  uVar14 = scale_expansion_zeroelim(iVar6,adStack_d2038,b_04,adStack_d3838);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d3838[uVar15] = adStack_d3838[uVar15] + adStack_d3838[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_d2038,b_13,adStack_c6038);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_ccc38,uVar14,adStack_d3838,adStack_b8838);
  iVar6 = fast_expansion_sum_zeroelim(iVar13,adStack_b8838,iVar6,adStack_c6038,adStack_af838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_bd038,iVar12,adStack_c1838,adStack_ab038);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,adStack_af838,iVar11,adStack_ab038,adStack_94838);
  iVar11 = scale_expansion_zeroelim(iVar4,adStack_d4eb8,dStack_d51c8,adStack_d4e38);
  iVar12 = scale_expansion_zeroelim(iVar4,adStack_d4eb8,dStack_d51d8,adStack_d4938);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_d4e38,iVar12,adStack_d4938,adStack_d4b38);
  iVar12 = scale_expansion_zeroelim(iVar9,adStack_d4838,-b_00,adStack_d4e38);
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_d4838,-dVar1,adStack_d4938);
  iVar9 = fast_expansion_sum_zeroelim(iVar12,adStack_d4e38,iVar9,adStack_d4938,adStack_d4d38);
  iVar12 = scale_expansion_zeroelim(iVar7,adStack_d4fb8,dStack_d5278,adStack_d4e38);
  iVar7 = scale_expansion_zeroelim(iVar7,adStack_d4fb8,dStack_d5288,adStack_d4938);
  iVar7 = fast_expansion_sum_zeroelim(iVar12,adStack_d4e38,iVar7,adStack_d4938,adStack_d3e38);
  iVar9 = fast_expansion_sum_zeroelim(iVar11,adStack_d4b38,iVar9,adStack_d4d38,adStack_d3c38);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_d3e38,iVar9,adStack_d3c38,adStack_d4438);
  iVar9 = scale_expansion_zeroelim(iVar7,adStack_d4438,b_05,adStack_c6c38);
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_c6c38,b_05,adStack_c8438);
  iVar11 = scale_expansion_zeroelim(iVar7,adStack_d4438,b_14,adStack_cd838);
  uVar14 = scale_expansion_zeroelim(iVar11,adStack_cd838,b_05,adStack_cf038);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_cf038[uVar15] = adStack_cf038[uVar15] + adStack_cf038[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_cd838,b_14,adStack_c3038);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_c8438,uVar14,adStack_cf038,adStack_b2838);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_b2838,iVar11,adStack_c3038,adStack_bd038);
  iVar11 = scale_expansion_zeroelim(iVar7,adStack_d4438,b_06,adStack_c9038);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_c9038,b_06,adStack_ca838);
  iVar12 = scale_expansion_zeroelim(iVar7,adStack_d4438,b_15,adStack_cfc38);
  uVar14 = scale_expansion_zeroelim(iVar12,adStack_cfc38,b_06,adStack_d1438);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d1438[uVar15] = adStack_d1438[uVar15] + adStack_d1438[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_cfc38,b_15,adStack_c4838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_ca838,uVar14,adStack_d1438,adStack_b5838);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_b5838,iVar12,adStack_c4838,adStack_c1838);
  iVar12 = scale_expansion_zeroelim(iVar7,adStack_d4438,b_07,adStack_cb438);
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_cb438,b_07,adStack_ccc38);
  iVar7 = scale_expansion_zeroelim(iVar7,adStack_d4438,b_16,adStack_d2038);
  uVar14 = scale_expansion_zeroelim(iVar7,adStack_d2038,b_07,adStack_d3838);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d3838[uVar15] = adStack_d3838[uVar15] + adStack_d3838[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar7 = scale_expansion_zeroelim(iVar7,adStack_d2038,b_16,adStack_c6038);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_ccc38,uVar14,adStack_d3838,adStack_b8838);
  iVar7 = fast_expansion_sum_zeroelim(iVar12,adStack_b8838,iVar7,adStack_c6038,adStack_af838);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_bd038,iVar11,adStack_c1838,adStack_ab038);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_af838,iVar9,adStack_ab038,adStack_a2038);
  iVar9 = scale_expansion_zeroelim(iVar5,adStack_d4f38,b_00,adStack_d4e38);
  iVar5 = scale_expansion_zeroelim(iVar5,adStack_d4f38,dVar1,adStack_d4938);
  iVar5 = fast_expansion_sum_zeroelim(iVar9,adStack_d4e38,iVar5,adStack_d4938,adStack_d4b38);
  iVar9 = scale_expansion_zeroelim(iVar8,adStack_d5038,dStack_d5278,adStack_d4e38);
  iVar8 = scale_expansion_zeroelim(iVar8,adStack_d5038,dStack_d5288,adStack_d4938);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,adStack_d4e38,iVar8,adStack_d4938,adStack_d4d38);
  iVar9 = scale_expansion_zeroelim(iVar4,adStack_d4eb8,b_07,adStack_d4e38);
  iVar4 = scale_expansion_zeroelim(iVar4,adStack_d4eb8,b_16,adStack_d4938);
  iVar4 = fast_expansion_sum_zeroelim(iVar9,adStack_d4e38,iVar4,adStack_d4938,adStack_d3e38);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,adStack_d4b38,iVar8,adStack_d4d38,adStack_d3c38);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,adStack_d3e38,iVar5,adStack_d3c38,adStack_d4438);
  iVar5 = scale_expansion_zeroelim(iVar4,adStack_d4438,b_08,adStack_c6c38);
  iVar5 = scale_expansion_zeroelim(iVar5,adStack_c6c38,b_08,adStack_c8438);
  iVar8 = scale_expansion_zeroelim(iVar4,adStack_d4438,b_17,adStack_cd838);
  uVar14 = scale_expansion_zeroelim(iVar8,adStack_cd838,b_08,adStack_cf038);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_cf038[uVar15] = adStack_cf038[uVar15] + adStack_cf038[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar8 = scale_expansion_zeroelim(iVar8,adStack_cd838,b_17,adStack_c3038);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,adStack_c8438,uVar14,adStack_cf038,adStack_b2838);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,adStack_b2838,iVar8,adStack_c3038,adStack_bd038);
  iVar8 = scale_expansion_zeroelim(iVar4,adStack_d4438,b_01,adStack_c9038);
  iVar8 = scale_expansion_zeroelim(iVar8,adStack_c9038,b_01,adStack_ca838);
  iVar9 = scale_expansion_zeroelim(iVar4,adStack_d4438,b_09,adStack_cfc38);
  uVar14 = scale_expansion_zeroelim(iVar9,adStack_cfc38,b_01,adStack_d1438);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d1438[uVar15] = adStack_d1438[uVar15] + adStack_d1438[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_cfc38,b_09,adStack_c4838);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_ca838,uVar14,adStack_d1438,adStack_b5838);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_b5838,iVar9,adStack_c4838,adStack_c1838);
  iVar9 = scale_expansion_zeroelim(iVar4,adStack_d4438,dVar3,adStack_cb438);
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_cb438,dVar3,adStack_ccc38);
  iVar4 = scale_expansion_zeroelim(iVar4,adStack_d4438,b_02,adStack_d2038);
  uVar14 = scale_expansion_zeroelim(iVar4,adStack_d2038,dVar3,adStack_d3838);
  if (0 < (int)uVar14) {
    uVar15 = 0;
    do {
      adStack_d3838[uVar15] = adStack_d3838[uVar15] + adStack_d3838[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
  }
  iVar4 = scale_expansion_zeroelim(iVar4,adStack_d2038,b_02,adStack_c6038);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_ccc38,uVar14,adStack_d3838,adStack_b8838);
  iVar4 = fast_expansion_sum_zeroelim(iVar9,adStack_b8838,iVar4,adStack_c6038,adStack_af838);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,adStack_bd038,iVar8,adStack_c1838,adStack_ab038);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,adStack_af838,iVar5,adStack_ab038,adStack_79838);
  iVar5 = fast_expansion_sum_zeroelim(iVar10,adStack_87038,iVar6,adStack_94838,adStack_1b038);
  iVar4 = fast_expansion_sum_zeroelim(iVar7,adStack_a2038,iVar4,adStack_79838,adStack_36038);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,adStack_1b038,iVar4,adStack_36038,adStack_6c040 + 1);
  return adStack_6c040[iVar4];
}

Assistant:

REAL insphereslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, cxdy7, dxay7, axcy7, bxdy7;
  INEXACT REAL bxay7, cxby7, dxcy7, axdy7, cxay7, dxby7;
  REAL axby[8], bxcy[8], cxdy[8], dxay[8], axcy[8], bxdy[8];
  REAL bxay[8], cxby[8], dxcy[8], axdy[8], cxay[8], dxby[8];
  REAL ab[16], bc[16], cd[16], da[16], ac[16], bd[16];
  int ablen, bclen, cdlen, dalen, aclen, bdlen;
  REAL temp32a[32], temp32b[32], temp64a[64], temp64b[64], temp64c[64];
  int temp32alen, temp32blen, temp64alen, temp64blen, temp64clen;
  REAL temp128[128], temp192[192];
  int temp128len, temp192len;
  REAL detx[384], detxx[768], detxt[384], detxxt[768], detxtxt[768];
  int xlen, xxlen, xtlen, xxtlen, xtxtlen;
  REAL x1[1536], x2[2304];
  int x1len, x2len;
  REAL dety[384], detyy[768], detyt[384], detyyt[768], detytyt[768];
  int ylen, yylen, ytlen, yytlen, ytytlen;
  REAL y1[1536], y2[2304];
  int y1len, y2len;
  REAL detz[384], detzz[768], detzt[384], detzzt[768], detztzt[768];
  int zlen, zzlen, ztlen, zztlen, ztztlen;
  REAL z1[1536], z2[2304];
  int z1len, z2len;
  REAL detxy[4608];
  int xylen;
  REAL adet[6912], bdet[6912], cdet[6912], ddet[6912];
  int alen, blen, clen, dlen;
  REAL abdet[13824], cddet[13824], deter[27648];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pe[0], aex, aextail);
  Two_Diff(pa[1], pe[1], aey, aeytail);
  Two_Diff(pa[2], pe[2], aez, aeztail);
  Two_Diff(pb[0], pe[0], bex, bextail);
  Two_Diff(pb[1], pe[1], bey, beytail);
  Two_Diff(pb[2], pe[2], bez, beztail);
  Two_Diff(pc[0], pe[0], cex, cextail);
  Two_Diff(pc[1], pe[1], cey, ceytail);
  Two_Diff(pc[2], pe[2], cez, ceztail);
  Two_Diff(pd[0], pe[0], dex, dextail);
  Two_Diff(pd[1], pe[1], dey, deytail);
  Two_Diff(pd[2], pe[2], dez, deztail);

  Two_Two_Product(aex, aextail, bey, beytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(bex, bextail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  ablen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, ab);
  Two_Two_Product(bex, bextail, cey, ceytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  bclen = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, bc);
  Two_Two_Product(cex, cextail, dey, deytail,
                  cxdy7, cxdy[6], cxdy[5], cxdy[4],
                  cxdy[3], cxdy[2], cxdy[1], cxdy[0]);
  cxdy[7] = cxdy7;
  negate = -cey;
  negatetail = -ceytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxcy7, dxcy[6], dxcy[5], dxcy[4],
                  dxcy[3], dxcy[2], dxcy[1], dxcy[0]);
  dxcy[7] = dxcy7;
  cdlen = fast_expansion_sum_zeroelim(8, cxdy, 8, dxcy, cd);
  Two_Two_Product(dex, dextail, aey, aeytail,
                  dxay7, dxay[6], dxay[5], dxay[4],
                  dxay[3], dxay[2], dxay[1], dxay[0]);
  dxay[7] = dxay7;
  negate = -dey;
  negatetail = -deytail;
  Two_Two_Product(aex, aextail, negate, negatetail,
                  axdy7, axdy[6], axdy[5], axdy[4],
                  axdy[3], axdy[2], axdy[1], axdy[0]);
  axdy[7] = axdy7;
  dalen = fast_expansion_sum_zeroelim(8, dxay, 8, axdy, da);
  Two_Two_Product(aex, aextail, cey, ceytail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  aclen = fast_expansion_sum_zeroelim(8, axcy, 8, cxay, ac);
  Two_Two_Product(bex, bextail, dey, deytail,
                  bxdy7, bxdy[6], bxdy[5], bxdy[4],
                  bxdy[3], bxdy[2], bxdy[1], bxdy[0]);
  bxdy[7] = bxdy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxby7, dxby[6], dxby[5], dxby[4],
                  dxby[3], dxby[2], dxby[1], dxby[0]);
  dxby[7] = dxby7;
  bdlen = fast_expansion_sum_zeroelim(8, bxdy, 8, dxby, bd);

  temp32alen = scale_expansion_zeroelim(cdlen, cd, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, -beztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, ceztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(bclen, bc, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, -deztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, aex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, aex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, aextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, aex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, aextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, aey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, aey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, aeytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, aey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, aeytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, aez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, aez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, aeztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, aez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, aeztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  alen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, adet);

  temp32alen = scale_expansion_zeroelim(dalen, da, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, ceztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, dez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, deztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(cdlen, cd, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, aeztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, bex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, bex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, bextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, bex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, bextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, bey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, bey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, beytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, bey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, beytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, bez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, bez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, beztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, bez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, beztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  blen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, bdet);

  temp32alen = scale_expansion_zeroelim(ablen, ab, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, -deztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, -aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, -aeztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(dalen, da, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, -beztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, cex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, cex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, cextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, cex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, cextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, cey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, cey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, ceytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, cey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, ceytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, cez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, cez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, ceztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, cez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, ceztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  clen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, cdet);

  temp32alen = scale_expansion_zeroelim(bclen, bc, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, aeztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, -beztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(ablen, ab, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, ceztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, dex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, dex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, dextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, dex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, dextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, dey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, dey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, deytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, dey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, deytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, dez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, dez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, deztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, dez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, deztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  dlen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}